

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thermo.cpp
# Opt level: O0

void __thiscall
IO::Thermo::setLowerTemperatureCoefficients
          (Thermo *this,double al1,double al2,double al3,double al4,double al5,double al6,double al7
          )

{
  double local_48;
  double al7_local;
  double al6_local;
  double al5_local;
  double al4_local;
  double al3_local;
  double al2_local;
  double al1_local;
  Thermo *this_local;
  
  local_48 = al7;
  al7_local = al6;
  al6_local = al5;
  al5_local = al4;
  al4_local = al3;
  al3_local = al2;
  al2_local = al1;
  al1_local = (double)this;
  std::vector<double,_std::allocator<double>_>::clear(&this->al_);
  std::vector<double,_std::allocator<double>_>::push_back(&this->al_,&al2_local);
  std::vector<double,_std::allocator<double>_>::push_back(&this->al_,&al3_local);
  std::vector<double,_std::allocator<double>_>::push_back(&this->al_,&al4_local);
  std::vector<double,_std::allocator<double>_>::push_back(&this->al_,&al5_local);
  std::vector<double,_std::allocator<double>_>::push_back(&this->al_,&al6_local);
  std::vector<double,_std::allocator<double>_>::push_back(&this->al_,&al7_local);
  std::vector<double,_std::allocator<double>_>::push_back(&this->al_,&local_48);
  return;
}

Assistant:

void IO::Thermo::setLowerTemperatureCoefficients(
        double al1, double al2, double al3,
        double al4, double al5,
        double al6, double al7) {
    al_.clear();
    al_.push_back(al1);
    al_.push_back(al2);
    al_.push_back(al3);
    al_.push_back(al4);
    al_.push_back(al5);
    al_.push_back(al6);
    al_.push_back(al7);
}